

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

OrderedArgumentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OrderedArgumentSyntax,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,PropertyExprSyntax *args)

{
  OrderedArgumentSyntax *this_00;
  PropertyExprSyntax *args_local;
  BumpAllocator *this_local;
  
  this_00 = (OrderedArgumentSyntax *)allocate(this,0x18,8);
  slang::syntax::OrderedArgumentSyntax::OrderedArgumentSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }